

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O2

char * replaceChar(char *stri,char ch1,char ch2)

{
  int i;
  ulong uVar1;
  string seq;
  allocator<char> local_39;
  char *local_38;
  ulong local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,stri,&local_39);
  for (uVar1 = 0; uVar1 < local_30; uVar1 = uVar1 + 1) {
    if (local_38[uVar1] == ch1) {
      local_38[uVar1] = ch2;
    }
  }
  strcpy(stri,local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return stri;
}

Assistant:

char* replaceChar(char *stri, char ch1, char ch2) {
    std::string seq(stri);
    // cout << seq.length() << endl;
    for (int i = 0; i < seq.length(); ++i) {
        if (seq[i] == ch1)
            seq[i] = ch2;
    }
    // char output[seq.length()+1];
    strcpy(stri, seq.c_str());
    return stri;
}